

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O3

idx_t duckdb::ExpressionHeuristics::ExpressionCost(BoundFunctionExpression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  type expr_00;
  idx_t iVar2;
  iterator iVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  long lVar4;
  long lVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  function_costs;
  undefined1 local_303;
  undefined1 local_302;
  undefined1 local_301;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_300;
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined8 local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined8 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  undefined8 local_28;
  
  local_2c8[0] = local_2b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"+","");
  local_2a8 = 5;
  local_2a0[0] = local_290;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"-","");
  local_280 = 5;
  local_278[0] = local_268;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"&","");
  local_258 = 5;
  local_250[0] = local_240;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"#","");
  local_230 = 5;
  local_228[0] = local_218;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,">>","");
  local_208 = 5;
  local_200[0] = local_1f0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"<<","");
  local_1e0 = 5;
  local_1d8[0] = local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"abs","");
  local_1b8 = 5;
  local_1b0[0] = local_1a0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,anon_var_dwarf_63726a0 + 8,anon_var_dwarf_63726a0 + 9);
  local_190 = 10;
  local_188[0] = local_178;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"%","");
  local_168 = 10;
  local_160[0] = local_150;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/","");
  local_140 = 0xf;
  local_138[0] = local_128;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"date_part","");
  local_118 = 0x14;
  local_110[0] = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"year","");
  local_f0 = 0x14;
  local_e8[0] = local_d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"round","");
  local_c8 = 100;
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"~~","");
  local_a0 = 200;
  local_98[0] = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"!~~","");
  local_78 = 200;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"regexp_matches","");
  local_50 = 200;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"||","");
  local_28 = 200;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,unsigned_long>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_300,local_2c8,&stack0xffffffffffffffe0,0,&local_301,&local_302,&local_303);
  lVar5 = 0;
  do {
    if (local_38 + lVar5 != *(undefined1 **)((long)local_48 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar5));
    }
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x2a8);
  puVar1 = (expr->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 0;
  for (this = (expr->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this);
    iVar2 = Cost(expr_00);
    lVar5 = lVar5 + iVar2;
  }
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_300,
                 &(expr->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name
                );
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    lVar4 = 1000;
  }
  else {
    lVar4 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            ._M_cur + 0x28);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_300);
  return lVar4 + lVar5;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundFunctionExpression &expr) {
	unordered_map<std::string, idx_t> function_costs = {
	    {"+", 5},       {"-", 5},    {"&", 5},          {"#", 5},
	    {">>", 5},      {"<<", 5},   {"abs", 5},        {"*", 10},
	    {"%", 10},      {"/", 15},   {"date_part", 20}, {"year", 20},
	    {"round", 100}, {"~~", 200}, {"!~~", 200},      {"regexp_matches", 200},
	    {"||", 200}};

	idx_t cost_children = 0;
	for (auto &child : expr.children) {
		cost_children += Cost(*child);
	}

	auto cost_function = function_costs.find(expr.function.name);
	if (cost_function != function_costs.end()) {
		return cost_children + cost_function->second;
	} else {
		return cost_children + 1000;
	}
}